

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_chan.c
# Opt level: O2

uint16_t s_chan_get_(s_chan_t *chan,void **out_object,uint16_t *number)

{
  ushort uVar1;
  uint16_t uVar2;
  size_t __n;
  uint uVar3;
  ulong uVar4;
  ushort uVar5;
  uint uVar6;
  s_chan_t *__src;
  void *__dest;
  
  uVar3._0_2_ = chan->available_count;
  uVar3._2_2_ = chan->element_size;
  uVar6 = (uint)*number;
  if ((ushort)(undefined2)uVar3 < *number) {
    uVar6 = uVar3;
  }
  uVar1 = chan->begin;
  uVar2 = (uint16_t)uVar6;
  uVar5 = uVar2 + uVar1;
  if (uVar5 < chan->max_count) {
    __dest = *out_object;
    __src = (s_chan_t *)((long)&chan[1].max_count + (ulong)uVar1 * (ulong)chan->element_size);
    uVar4 = (ulong)(uVar6 & 0xffff);
    __n = chan->element_size * uVar4;
  }
  else {
    uVar3 = (uint)chan->max_count - (uint)uVar1;
    __src = chan + 1;
    uVar4 = (ulong)(uVar3 & 0xffff);
    memcpy(*out_object,
           (uint16_t *)((long)&chan[1].max_count + (ulong)uVar1 * (ulong)chan->element_size),
           chan->element_size * uVar4);
    uVar1 = chan->element_size;
    __dest = (void *)(uVar4 * uVar1 + (long)*out_object);
    *out_object = __dest;
    uVar6 = uVar6 - uVar3;
    uVar5 = (ushort)uVar6;
    uVar4 = (ulong)(uVar6 & 0xffff);
    __n = uVar1 * uVar4;
  }
  memcpy(__dest,__src,__n);
  *out_object = (void *)((long)*out_object + chan->element_size * uVar4);
  chan->begin = uVar5;
  chan->available_count = chan->available_count - uVar2;
  *number = *number - uVar2;
  return uVar2;
}

Assistant:

uint16_t s_chan_get_(s_chan_t *chan, void **out_object, uint16_t *number) {
    uint16_t end;
    uint16_t count;
    
    count = chan->available_count;
    if(count > *number)
        count = *number;
    
    end = chan->begin + count;
    if(end >= chan->max_count) {
        uint16_t count0 = chan->max_count - chan->begin;
        memcpy(*out_object, (char *)&chan[1] + chan->begin * (size_t)chan->element_size, count0 * (size_t)chan->element_size);
        *out_object = (void *)((char *)*out_object + count0 * (size_t)chan->element_size);

        count0 = count - count0;
        memcpy(*out_object, (char *)&chan[1], count0 * (size_t)chan->element_size);
        *out_object = (void*)((char*)*out_object + count0 * (size_t)chan->element_size);

        chan->begin = count0;
    }
    else {
        memcpy(*out_object, (char *)&chan[1] + chan->begin * (size_t)chan->element_size, count * (size_t)chan->element_size);
        *out_object = (void*)((char*)*out_object + count * (size_t)chan->element_size);

        chan->begin = end;
    }

    chan->available_count -= count;
    *number -= count;

    return count;
}